

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemberSymbols.h
# Opt level: O2

void __thiscall
slang::ast::RandSeqProductionSymbol::visitExprs<netlist::ContinuousAssignVisitor&>
          (RandSeqProductionSymbol *this,ContinuousAssignVisitor *visitor)

{
  pointer ppPVar1;
  Expression *pEVar2;
  Expression *pEVar3;
  pointer pRVar4;
  pointer pRVar5;
  pointer ppPVar6;
  long lVar7;
  CaseItem *item;
  pointer ppEVar8;
  RepeatProd *rp;
  ProdItem *this_00;
  pointer ppEVar9;
  span<const_slang::ast::RandSeqProductionSymbol::Rule,_18446744073709551615UL> sVar10;
  
  sVar10 = getRules(this);
  pRVar4 = sVar10._M_ptr;
  pRVar5 = pRVar4 + sVar10._M_extent._M_extent_value._M_extent_value;
  do {
    if (pRVar4 == pRVar5) {
      return;
    }
    ppPVar6 = (pRVar4->prods)._M_ptr;
    ppPVar1 = ppPVar6 + (pRVar4->prods)._M_extent._M_extent_value;
    for (; ppPVar6 != ppPVar1; ppPVar6 = ppPVar6 + 1) {
      this_00 = (ProdItem *)*ppPVar6;
      switch((this_00->super_ProdBase).kind) {
      case IfElse:
        Expression::visit<netlist::ContinuousAssignVisitor&>((Expression *)this_00->target,visitor);
        ProdItem::visitExprs<netlist::ContinuousAssignVisitor&>((ProdItem *)&this_00->args,visitor);
        if (*(char *)&this_00[2].args._M_ptr == '\x01') {
          this_00 = (ProdItem *)&this_00[1].args;
          goto switchD_00175f0d_caseD_0;
        }
        break;
      case Repeat:
        Expression::visit<netlist::ContinuousAssignVisitor&>((Expression *)this_00->target,visitor);
        this_00 = (ProdItem *)&this_00->args;
      case Item:
switchD_00175f0d_caseD_0:
        ProdItem::visitExprs<netlist::ContinuousAssignVisitor&>(this_00,visitor);
        break;
      case Case:
        Expression::visit<netlist::ContinuousAssignVisitor&>((Expression *)this_00->target,visitor);
        if ((char)this_00[2].super_ProdBase.kind == CodeBlock) {
          ProdItem::visitExprs<netlist::ContinuousAssignVisitor&>(this_00 + 1,visitor);
        }
        ppEVar8 = (this_00->args)._M_ptr;
        ppEVar9 = ppEVar8 + (this_00->args)._M_extent._M_extent_value * 6;
        for (; ppEVar8 != ppEVar9; ppEVar8 = ppEVar8 + 6) {
          pEVar2 = *ppEVar8;
          pEVar3 = ppEVar8[1];
          for (lVar7 = 0; (long)pEVar3 << 3 != lVar7; lVar7 = lVar7 + 8) {
            Expression::visit<netlist::ContinuousAssignVisitor&>
                      (*(Expression **)((long)&pEVar2->kind + lVar7),visitor);
          }
          ProdItem::visitExprs<netlist::ContinuousAssignVisitor&>((ProdItem *)(ppEVar8 + 2),visitor)
          ;
        }
      }
    }
    if (pRVar4->weightExpr != (Expression *)0x0) {
      Expression::visit<netlist::ContinuousAssignVisitor&>(pRVar4->weightExpr,visitor);
    }
    if (pRVar4->randJoinExpr != (Expression *)0x0) {
      Expression::visit<netlist::ContinuousAssignVisitor&>(pRVar4->randJoinExpr,visitor);
    }
    pRVar4 = pRVar4 + 1;
  } while( true );
}

Assistant:

void visitExprs(TVisitor&& visitor) const {
        for (auto& rule : getRules()) {
            for (auto prod : rule.prods) {
                switch (prod->kind) {
                    case ProdKind::Item:
                        ((const ProdItem*)prod)->visitExprs(visitor);
                        break;
                    case ProdKind::CodeBlock:
                        break;
                    case ProdKind::IfElse: {
                        auto& iep = *(const IfElseProd*)prod;
                        iep.expr->visit(visitor);
                        iep.ifItem.visitExprs(visitor);
                        if (iep.elseItem)
                            iep.elseItem->visitExprs(visitor);
                        break;
                    }
                    case ProdKind::Repeat: {
                        auto& rp = *(const RepeatProd*)prod;
                        rp.expr->visit(visitor);
                        rp.item.visitExprs(visitor);
                        break;
                    }
                    case ProdKind::Case: {
                        auto& cp = *(const CaseProd*)prod;
                        cp.expr->visit(visitor);
                        if (cp.defaultItem)
                            cp.defaultItem->visitExprs(visitor);

                        for (auto& item : cp.items) {
                            for (auto expr : item.expressions)
                                expr->visit(visitor);

                            item.item.visitExprs(visitor);
                        }
                        break;
                    }
                }
            }

            if (rule.weightExpr)
                rule.weightExpr->visit(visitor);

            if (rule.randJoinExpr)
                rule.randJoinExpr->visit(visitor);
        }
    }